

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O2

int XNVCTRLQueryValidTargetAttributeValues
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
              NVCTRLAttributeValidValuesRec *values)

{
  int iVar1;
  XExtDisplayInfo *info;
  undefined1 *puVar2;
  CARD32 *pCVar3;
  _func_int__XDisplay_ptr *p_Var4;
  CARD32 CVar5;
  long lStack_60;
  int target_id_local;
  int target_type_local;
  xnvCtrlQueryValidAttributeValuesReply rep;
  
  target_id_local = target_id;
  target_type_local = target_type;
  info = find_display(dpy);
  if (info == (XExtDisplayInfo *)0x0 || values == (NVCTRLAttributeValidValuesRec *)0x0) {
    return 0;
  }
  if (info->codes == (XExtCodes *)0x0) {
    return 0;
  }
  XNVCTRLCheckTargetData(dpy,info,&target_type_local,&target_id_local);
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->lock_display)(dpy);
  }
  puVar2 = (undefined1 *)_XGetRequest(dpy,5,0x10);
  *puVar2 = (char)info->codes->major_opcode;
  puVar2[1] = 5;
  *(undefined2 *)(puVar2 + 6) = (undefined2)target_type_local;
  *(undefined2 *)(puVar2 + 4) = (undefined2)target_id_local;
  *(uint *)(puVar2 + 8) = display_mask;
  *(uint *)(puVar2 + 0xc) = attribute;
  iVar1 = _XReply(dpy,&rep,0,1);
  if (iVar1 == 0) {
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->unlock_display)(dpy);
    }
    p_Var4 = dpy->synchandler;
    CVar5 = 0;
    goto LAB_001056c8;
  }
  values->type = rep.attr_type;
  if (rep.attr_type == 5) {
    pCVar3 = &rep.bits;
    lStack_60 = 4;
LAB_001056a0:
    *(CARD32 *)((long)&values->type + lStack_60) = *pCVar3;
  }
  else if (rep.attr_type == 4) {
    pCVar3 = (CARD32 *)&rep.max;
    (values->u).range.min = rep.min;
    lStack_60 = 8;
    goto LAB_001056a0;
  }
  values->permissions = rep.perms;
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->unlock_display)(dpy);
  }
  p_Var4 = dpy->synchandler;
  CVar5 = rep.flags;
LAB_001056c8:
  if (p_Var4 != (_func_int__XDisplay_ptr *)0x0) {
    (*p_Var4)(dpy);
  }
  return CVar5;
}

Assistant:

Bool XNVCTRLQueryValidTargetAttributeValues (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,                                 
    NVCTRLAttributeValidValuesRec *values
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryValidAttributeValuesReply rep;
    xnvCtrlQueryValidAttributeValuesReq   *req;
    Bool exists;
    
    if (!values) return False;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlQueryValidAttributeValues, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryValidAttributeValues;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    if (!_XReply (dpy, (xReply *) &rep, 0, xTrue)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    exists = rep.flags;
    values->type = rep.attr_type;
    if (rep.attr_type == ATTRIBUTE_TYPE_RANGE) {
        values->u.range.min = rep.min;
        values->u.range.max = rep.max;
    }
    if (rep.attr_type == ATTRIBUTE_TYPE_INT_BITS) {
        values->u.bits.ints = rep.bits;
    }
    values->permissions = rep.perms;
    UnlockDisplay (dpy);
    SyncHandle ();
    return exists;
}